

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O3

void avro::json::testLong(TestData<long> *d)

{
  long *plVar1;
  long local_e0;
  Entity n;
  any local_d0;
  EntityType *local_c8;
  long *local_c0;
  assertion_result local_b8;
  lazy_ostream local_a0;
  undefined8 *local_90;
  char *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined8 *local_70;
  EntityType **local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined8 *local_50;
  long **local_48;
  const_string local_40;
  
  avro::json::loadEntity((char *)&n);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c29f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a13dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x51;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001bf958;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_c0 = &local_e0;
  local_e0 = CONCAT44(local_e0._4_4_,_n);
  local_c8 = &d->type;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_n == d->type);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_58 = 0;
  local_68 = &local_c8;
  local_78 = 0;
  local_60 = &PTR__lazy_ostream_001bf998;
  local_80 = &PTR__lazy_ostream_001bf998;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_70 = &boost::unit_test::lazy_ostream::inst;
  local_48 = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_a0,&local_40,0x51,CHECK,CHECK_EQUAL,2,"n.type()",&local_60,"d.type",
             &local_80);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c29f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a13dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x52;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001bf958;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  avro::json::Entity::ensureType((EntityType)&n);
  plVar1 = boost::any_cast<long_const&>(&local_d0);
  local_e0 = *plVar1;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_e0 == d->value);
  local_c8 = (EntityType *)&d->value;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_c0 = &local_e0;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_001beec0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_001beec0;
  local_70 = &boost::unit_test::lazy_ostream::inst;
  local_68 = &local_c8;
  local_48 = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_a0,&local_40,0x52,CHECK,CHECK_EQUAL,2,"n.longValue()",&local_60,
             "d.value",&local_80);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if (local_d0.content != (placeholder *)0x0) {
    (**(code **)(*(long *)local_d0.content + 8))();
  }
  return;
}

Assistant:

void testLong(const TestData<int64_t>& d)
{
    Entity n = loadEntity(d.input);
    BOOST_CHECK_EQUAL(n.type(), d.type);
    BOOST_CHECK_EQUAL(n.longValue(), d.value);
}